

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

bool __thiscall
File::writeAttributeMap
          (File *this,
          map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
          *value)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  ByteString *pBVar3;
  size_t sVar4;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *p_Var5;
  _Base_ptr p_Var6;
  unsigned_long uVar7;
  ByteString val;
  long local_d8;
  OSAttribute attr;
  
  if (this->valid == true) {
    p_Var1 = &(value->_M_t)._M_impl.super__Rb_tree_header;
    uVar7 = 0;
    for (p_Var6 = (value->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != p_Var1; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      OSAttribute::OSAttribute(&attr,(OSAttribute *)&p_Var6[1]._M_parent);
      bVar2 = OSAttribute::isBooleanAttribute(&attr);
      if (bVar2) {
        uVar7 = uVar7 + 0x11;
LAB_00131ac2:
        bVar2 = true;
      }
      else {
        bVar2 = OSAttribute::isUnsignedLongAttribute(&attr);
        if (bVar2) {
          uVar7 = uVar7 + 0x18;
          goto LAB_00131ac2;
        }
        bVar2 = OSAttribute::isByteStringAttribute(&attr);
        if (bVar2) {
          pBVar3 = OSAttribute::getByteStringValue(&attr);
          ByteString::ByteString(&val,pBVar3);
          sVar4 = ByteString::size(&val);
          uVar7 = uVar7 + sVar4 + 0x18;
          ByteString::~ByteString(&val);
          goto LAB_00131ac2;
        }
        bVar2 = OSAttribute::isMechanismTypeSetAttribute(&attr);
        if (bVar2) {
          p_Var5 = &OSAttribute::getMechanismTypeSetValue(&attr)->_M_t;
          std::
          _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
          ::_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)&val,p_Var5);
          uVar7 = uVar7 + local_d8 * 8 + 0x18;
          std::
          _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
          ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)&val);
          goto LAB_00131ac2;
        }
        uVar7 = uVar7 + 0x10;
        bVar2 = false;
      }
      OSAttribute::~OSAttribute(&attr);
      if (!bVar2) {
        return false;
      }
    }
    bVar2 = writeULong(this,uVar7);
    if (bVar2) {
      p_Var6 = (value->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      while( true ) {
        if ((_Rb_tree_header *)p_Var6 == p_Var1) {
          return true;
        }
        OSAttribute::OSAttribute(&attr,(OSAttribute *)&p_Var6[1]._M_parent);
        bVar2 = writeULong(this,*(unsigned_long *)(p_Var6 + 1));
        if (!bVar2) break;
        bVar2 = OSAttribute::isBooleanAttribute(&attr);
        if (!bVar2) {
          bVar2 = OSAttribute::isUnsignedLongAttribute(&attr);
          if (bVar2) {
            bVar2 = writeULong(this,2);
            if (bVar2) {
              uVar7 = OSAttribute::getUnsignedLongValue(&attr);
              bVar2 = writeULong(this,uVar7);
              goto LAB_00131ba8;
            }
          }
          else {
            bVar2 = OSAttribute::isByteStringAttribute(&attr);
            if (bVar2) {
              bVar2 = writeULong(this,3);
              if (bVar2) {
                pBVar3 = OSAttribute::getByteStringValue(&attr);
                ByteString::ByteString(&val,pBVar3);
                bVar2 = writeByteString(this,&val);
                ByteString::~ByteString(&val);
LAB_00131c52:
                if (bVar2 != false) goto LAB_00131bb0;
              }
            }
            else {
              bVar2 = OSAttribute::isMechanismTypeSetAttribute(&attr);
              if (!bVar2) goto LAB_00131bb0;
              bVar2 = writeULong(this,5);
              if (bVar2) {
                p_Var5 = &OSAttribute::getMechanismTypeSetValue(&attr)->_M_t;
                std::
                _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                ::_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                            *)&val,p_Var5);
                bVar2 = writeMechanismTypeSet
                                  (this,(set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                         *)&val);
                std::
                _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                             *)&val);
                goto LAB_00131c52;
              }
            }
          }
          break;
        }
        bVar2 = writeULong(this,1);
        if (!bVar2) break;
        bVar2 = OSAttribute::getBooleanValue(&attr);
        bVar2 = writeBool(this,bVar2);
LAB_00131ba8:
        if (bVar2 == false) break;
LAB_00131bb0:
        OSAttribute::~OSAttribute(&attr);
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      }
      OSAttribute::~OSAttribute(&attr);
    }
  }
  return false;
}

Assistant:

bool File::writeAttributeMap(const std::map<CK_ATTRIBUTE_TYPE,OSAttribute>& value)
{
	if (!valid) return false;

	// compute length
	unsigned long len = 0;
	for (std::map<CK_ATTRIBUTE_TYPE,OSAttribute>::const_iterator i = value.begin(); i != value.end(); ++i)
	{
		OSAttribute attr = i->second;
		// count attribute type and kind
		len += 8 + 8;

		if (attr.isBooleanAttribute())
		{
			len += 1;
		}
		else if (attr.isUnsignedLongAttribute())
		{
			len += 8;
		}
		else if (attr.isByteStringAttribute())
		{
			ByteString val = attr.getByteStringValue();
			len += 8 + val.size();
		}
		else if (attr.isMechanismTypeSetAttribute())
		{
			std::set<CK_MECHANISM_TYPE> val = attr.getMechanismTypeSetValue();
			len += 8 + val.size() * 8;
		}
		else
		{
			return false;
		}
	}

	// write length
	if (!writeULong(len))
	{
		return false;
	}

	// write each attribute
	for (std::map<CK_ATTRIBUTE_TYPE,OSAttribute>::const_iterator i = value.begin(); i != value.end(); ++i)
	{
		OSAttribute attr = i->second;
		unsigned long attrType = (unsigned long) i->first;
		if (!writeULong(attrType))
		{
			return false;
		}

		if (attr.isBooleanAttribute())
		{
			unsigned long attrKind = akBoolean;
			if (!writeULong(attrKind))
			{
				return false;
			}

			bool val = attr.getBooleanValue();
			if (!writeBool(val))
			{
				return false;
			}
		}
		else if (attr.isUnsignedLongAttribute())
		{
			unsigned long attrKind = akInteger;
			if (!writeULong(attrKind))
			{
				return false;
			}

			unsigned long val = attr.getUnsignedLongValue();
			if (!writeULong(val))
			{
				return false;
			}
		}
		else if (attr.isByteStringAttribute())
		{
			unsigned long attrKind = akBinary;
			if (!writeULong(attrKind))
			{
				return false;
			}

			ByteString val = attr.getByteStringValue();
			if (!writeByteString(val))
			{
				return false;
			}
		}
		else if (attr.isMechanismTypeSetAttribute())
		{
			unsigned long attrKind = akMechSet;
			if (!writeULong(attrKind))
			{
				return false;
			}

			std::set<CK_MECHANISM_TYPE> val = attr.getMechanismTypeSetValue();
			if (!writeMechanismTypeSet(val))
			{
				return false;
			}
		}
	}

	return true;
}